

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O2

void google::protobuf::compiler::ParseGeneratorParameter
               (string *text,
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *output)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  undefined1 in_R9B;
  StringPiece full;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  value;
  StringPiece local_60;
  string local_50 [32];
  
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_60,text);
  full.length_ = (size_type)",";
  full.ptr_ = (char *)local_60.length_;
  Split_abi_cxx11_(&parts,(protobuf *)local_60.ptr_,full,(char *)0x1,(bool)in_R9B);
  lVar3 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    lVar1 = std::__cxx11::string::find
                      ((char)parts.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + (char)lVar3,0x3d);
    value.first._M_dataplus._M_p = (pointer)&value.first.field_2;
    value.first._M_string_length = 0;
    value.first.field_2._M_local_buf[0] = '\0';
    value.second._M_dataplus._M_p = (pointer)&value.second.field_2;
    value.second._M_string_length = 0;
    value.second.field_2._M_local_buf[0] = '\0';
    if (lVar1 == -1) {
      std::__cxx11::string::_M_assign((string *)&value);
      std::__cxx11::string::assign((char *)&value.second);
    }
    else {
      std::__cxx11::string::substr
                ((ulong)local_50,
                 (long)&((parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3);
      std::__cxx11::string::operator=((string *)&value,local_50);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::substr
                ((ulong)local_50,
                 (long)&((parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3);
      std::__cxx11::string::operator=((string *)&value.second,local_50);
      std::__cxx11::string::~string(local_50);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(output,&value);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&value);
    lVar3 = lVar3 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  return;
}

Assistant:

void ParseGeneratorParameter(
    const std::string& text,
    std::vector<std::pair<std::string, std::string> >* output) {
  std::vector<std::string> parts = Split(text, ",", true);

  for (int i = 0; i < parts.size(); i++) {
    std::string::size_type equals_pos = parts[i].find_first_of('=');
    std::pair<std::string, std::string> value;
    if (equals_pos == std::string::npos) {
      value.first = parts[i];
      value.second = "";
    } else {
      value.first = parts[i].substr(0, equals_pos);
      value.second = parts[i].substr(equals_pos + 1);
    }
    output->push_back(value);
  }
}